

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O1

lysc_node ** lysc_node_child_p(lysc_node *node)

{
  ushort uVar1;
  
  if ((node == (lysc_node *)0x0) || (uVar1 = node->nodetype, (uVar1 & 0x300) != 0)) {
    __assert_fail("node && !(node->nodetype & (LYS_RPC | LYS_ACTION))",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_schema_common.c"
                  ,0x68d,"struct lysc_node **lysc_node_child_p(const struct lysc_node *)");
  }
  if (uVar1 < 0x80) {
    if (((uVar1 == 1) || (uVar1 == 2)) || (uVar1 == 0x10)) goto LAB_00164b24;
  }
  else if (uVar1 < 0x1000) {
    if ((uVar1 == 0x80) || (uVar1 == 0x400)) {
LAB_00164b24:
      return (lysc_node **)(node + 1);
    }
  }
  else if ((uVar1 == 0x1000) || (uVar1 == 0x2000)) goto LAB_00164b24;
  return (lysc_node **)0x0;
}

Assistant:

struct lysc_node **
lysc_node_child_p(const struct lysc_node *node)
{
    assert(node && !(node->nodetype & (LYS_RPC | LYS_ACTION)));

    switch (node->nodetype) {
    case LYS_CONTAINER:
        return &((struct lysc_node_container *)node)->child;
    case LYS_CHOICE:
        return (struct lysc_node **)&((struct lysc_node_choice *)node)->cases;
    case LYS_CASE:
        return &((struct lysc_node_case *)node)->child;
    case LYS_LIST:
        return &((struct lysc_node_list *)node)->child;
    case LYS_INPUT:
    case LYS_OUTPUT:
        return &((struct lysc_node_action_inout *)node)->child;
    case LYS_NOTIF:
        return &((struct lysc_node_notif *)node)->child;
    default:
        return NULL;
    }
}